

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O1

bool wabt::IsValidUtf8(char *s,size_t s_length)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar2 = (byte *)(s + s_length);
  do {
    pbVar3 = (byte *)s;
    if (pbVar2 <= pbVar3) break;
    s = (char *)pbVar3;
    if (pbVar2 < pbVar3 + *(int *)((anonymous_namespace)::s_utf8_length + (ulong)*pbVar3 * 4)) {
switchD_00f689f8_caseD_0:
      bVar1 = false;
    }
    else {
      switch(*(int *)((anonymous_namespace)::s_utf8_length + (ulong)*pbVar3 * 4)) {
      case 0:
        goto switchD_00f689f8_caseD_0;
      case 1:
        s = (char *)(pbVar3 + 1);
      default:
        bVar1 = true;
        break;
      case 2:
        s = (char *)(pbVar3 + 2);
        bVar1 = false;
        break;
      case 3:
        s = (char *)(pbVar3 + 3);
        bVar1 = false;
        break;
      case 4:
        s = (char *)(pbVar3 + 4);
        bVar1 = false;
      }
    }
  } while (bVar1);
  return pbVar2 <= pbVar3;
}

Assistant:

bool IsValidUtf8(const char* s, size_t s_length) {
  const uint8_t* p = reinterpret_cast<const uint8_t*>(s);
  const uint8_t* end = p + s_length;
  while (p < end) {
    uint8_t cu0 = *p;
    int length = s_utf8_length[cu0];
    if (p + length > end) {
      return false;
    }

    switch (length) {
      case 0:
        return false;

      case 1:
        p++;
        break;

      case 2:
        p++;
        if (!IsCont(*p++)) {
          return false;
        }
        break;

      case 3: {
        p++;
        uint8_t cu1 = *p++;
        uint8_t cu2 = *p++;
        if (!(IsCont(cu1) && IsCont(cu2)) ||
            (cu0 == 0xe0 && cu1 < 0xa0) ||  // Overlong encoding.
            (cu0 == 0xed && cu1 >= 0xa0))   // UTF-16 surrogate halves.
          return false;
        break;
      }

      case 4: {
        p++;
        uint8_t cu1 = *p++;
        uint8_t cu2 = *p++;
        uint8_t cu3 = *p++;
        if (!(IsCont(cu1) && IsCont(cu2) && IsCont(cu3)) ||
            (cu0 == 0xf0 && cu1 < 0x90) ||  // Overlong encoding.
            (cu0 == 0xf4 && cu1 >= 0x90))   // Code point >= 0x11000.
          return false;
        break;
      }
    }
  }
  return true;
}